

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::GetIndexAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<2UL> *pJVar2;
  Var pvVar3;
  RecyclableObject *pRVar4;
  Var aValue;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)52>
                     (evt);
  pvVar3 = InflateVarInReplay(executeContext,pJVar2->VarArray[0]);
  if (pvVar3 != (Var)0x0) {
    BVar1 = Js::JavascriptOperators::IsObject(pvVar3);
    if (BVar1 != 0) {
      pRVar4 = Js::VarTo<Js::RecyclableObject>(pvVar3);
      if ((((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr != scriptContext) {
        pvVar3 = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
      }
      aValue = InflateVarInReplay(executeContext,pJVar2->VarArray[1]);
      if (aValue != (Var)0x0) {
        if ((ulong)aValue >> 0x30 == 0) {
          pRVar4 = Js::VarTo<Js::RecyclableObject>(aValue);
          if ((((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
              scriptContext.ptr != scriptContext) {
            aValue = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
          }
        }
        pvVar3 = Js::JavascriptOperators::OP_GetElementI(pvVar3,aValue,scriptContext);
        JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)52>
                  (executeContext,evt,pvVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

void GetIndexAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarArgumentAction, EventKind::GetIndexActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var index = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(index, ctx);

            Js::Var res = Js::JavascriptOperators::OP_GetElementI(var, index, ctx);

            JsRTActionHandleResultForReplay<JsRTDoubleVarArgumentAction, EventKind::GetIndexActionTag>(executeContext, evt, res);
        }